

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_send_ping_frame(void)

{
  _Bool _Var1;
  cio_error cVar2;
  char buffer [9];
  cio_write_buffer wbh;
  cio_write_buffer wb;
  char local_58 [16];
  cio_write_buffer local_48;
  cio_write_buffer local_28;
  
  local_28.data.head.q_len = (size_t)local_58;
  builtin_strncpy(local_58,"aaaaaaaa",9);
  local_28.next = &local_48;
  local_48.next = &local_28;
  local_28.data.element.length = 9;
  local_48.data.head.q_len = 1;
  local_48.data.element.length = 9;
  local_48.prev = local_48.next;
  local_28.prev = local_28.next;
  cVar2 = cio_websocket_write_ping(ws,local_28.next,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a ping frame did not succeed!",0x9d5,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)write_handler_fake.call_count,"Write handler was not called once",0x9d6,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_val,
             "websocket parameter of write_handler not correct",0x9d7,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_val != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0x9d8);
  }
  UnityAssertEqualNumber
            (0,(long)write_handler_fake.arg2_val,"err parameter of write_handler not correct",0x9d9,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)on_error_fake.call_count,"error callback was called",0x9db,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,local_48.data.head.q_len,"Length of write buffer different than before writing!",
             0x9dd,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&local_48,(UNITY_INT)(local_48.next)->next,
             "Concatenation of write buffers no longer correct after writing!",0x9de,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualMemory
            (local_58,((local_48.next)->data).element.field_0.const_data,9,1,
             "Content of writebuffer not correct after writing!",0x9df,UNITY_ARRAY_TO_ARRAY);
  _Var1 = check_frame(CIO_WEBSOCKET_PING_FRAME,local_58,9,true);
  if (_Var1) {
    return;
  }
  UnityFail("Written ping frame not correct",0x9e1);
}

Assistant:

static void test_send_ping_frame(void)
{
	char buffer[] = "aaaaaaaa";

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, buffer, sizeof(buffer));
	cio_write_buffer_queue_tail(&wbh, &wb);

	enum cio_error err = cio_websocket_write_ping(ws, &wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a ping frame did not succeed!");
	TEST_ASSERT_EQUAL_MESSAGE(1, write_handler_fake.call_count, "Write handler was not called once");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_val, "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_val, "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, write_handler_fake.arg2_val, "err parameter of write_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Length of write buffer different than before writing!");
	TEST_ASSERT_EQUAL_MESSAGE(&wbh, wbh.next->next, "Concatenation of write buffers no longer correct after writing!");
	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(buffer, wbh.next->data.element.data, sizeof(buffer), "Content of writebuffer not correct after writing!");

	TEST_ASSERT_TRUE_MESSAGE(check_frame(CIO_WEBSOCKET_PING_FRAME, buffer, sizeof(buffer), true), "Written ping frame not correct");
}